

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O1

Aig_Man_t * Ssw_FramesWithConstraints(Aig_Man_t *p,int nFrames)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  Aig_Obj_t *p1;
  long lVar10;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x35,"Aig_Man_t *Ssw_FramesWithConstraints(Aig_Man_t *, int)");
  }
  if (p->nObjs[2] <= p->nRegs) {
    __assert_fail("Aig_ManRegNum(p) < Aig_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x36,"Aig_Man_t *Ssw_FramesWithConstraints(Aig_Man_t *, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize * nFrames);
  if (0 < p->nRegs) {
    iVar3 = 0;
    do {
      uVar8 = p->nTruePis + iVar3;
      if (((int)uVar8 < 0) || (p->vCis->nSize <= (int)uVar8)) {
LAB_005df642:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCis->pArray[uVar8];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_005df661;
      *(ulong *)((long)pvVar1 + 0x28) = (ulong)p_00->pConst1 ^ 1;
      iVar3 = iVar3 + 1;
    } while (iVar3 < p->nRegs);
  }
  if (0 < nFrames) {
    iVar3 = 0;
    do {
      if (((ulong)p->pConst1 & 1) != 0) {
LAB_005df661:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x13f,"void Aig_ObjSetCopy(Aig_Obj_t *, Aig_Obj_t *)");
      }
      p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
      if (0 < p->nTruePis) {
        lVar10 = 0;
        do {
          if (p->vCis->nSize <= lVar10) goto LAB_005df642;
          pvVar1 = p->vCis->pArray[lVar10];
          pAVar5 = Aig_ObjCreateCi(p_00);
          if (((ulong)pvVar1 & 1) != 0) goto LAB_005df661;
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 < p->nTruePis);
      }
      pVVar6 = p->vObjs;
      if (0 < pVVar6->nSize) {
        lVar10 = 0;
        do {
          pvVar1 = pVVar6->pArray[lVar10];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_005df69f;
            uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar5 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            pAVar5 = Aig_And(p_00,pAVar5,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
          }
          lVar10 = lVar10 + 1;
          pVVar6 = p->vObjs;
        } while (lVar10 < pVVar6->nSize);
      }
      pVVar6 = p->vCos;
      if (0 < pVVar6->nSize) {
        lVar10 = 0;
        do {
          pvVar1 = pVVar6->pArray[lVar10];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005df69f:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar7;
          lVar10 = lVar10 + 1;
          pVVar6 = p->vCos;
        } while (lVar10 < pVVar6->nSize);
      }
      uVar7 = (ulong)(uint)p->nTruePos;
      if (0 < p->nTruePos) {
        lVar10 = 0;
        do {
          if (p->vCos->nSize <= lVar10) goto LAB_005df642;
          if ((long)(int)uVar7 - (long)p->nConstrs <= lVar10) {
            pvVar1 = p->vCos->pArray[lVar10];
            if (((ulong)pvVar1 & 1) != 0) goto LAB_005df680;
            Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x28) ^ 1));
          }
          lVar10 = lVar10 + 1;
          uVar7 = (ulong)p->nTruePos;
        } while (lVar10 < (long)uVar7);
      }
      if (0 < p->nRegs) {
        iVar4 = 0;
        do {
          uVar8 = p->nTruePos + iVar4;
          if (((((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) ||
              (uVar9 = p->nTruePis + iVar4, (int)uVar9 < 0)) || (p->vCis->nSize <= (int)uVar9))
          goto LAB_005df642;
          pvVar1 = p->vCos->pArray[uVar8];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005df680:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x13e,"Aig_Obj_t *Aig_ObjCopy(Aig_Obj_t *)");
          }
          pvVar2 = p->vCis->pArray[uVar9];
          if (((ulong)pvVar2 & 1) != 0) goto LAB_005df661;
          *(undefined8 *)((long)pvVar2 + 0x28) = *(undefined8 *)((long)pvVar1 + 0x28);
          iVar4 = iVar4 + 1;
        } while (iVar4 < p->nRegs);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != nFrames);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs initialized timeframes with constraints as POs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Ssw_FramesWithConstraints( Aig_Man_t * p, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
//    assert( Saig_ManConstrNum(p) > 0 );
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManRegNum(p) < Aig_ManCiNum(p) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p) * nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetCopy( pObj, Aig_ManConst0(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // map constants and PIs
        Aig_ObjSetCopy( Aig_ManConst1(p), Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjCreateCi(pFrames) );
        // add internal nodes of this frame
        Aig_ManForEachNode( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ) );
        // transfer to the primary output
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjSetCopy( pObj, Aig_ObjChild0Copy(pObj) );
        // create constraint outputs
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjCopy(pObj) ) );
        }
        // transfer latch inputs to the latch outputs
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Aig_ObjSetCopy( pObjLo, Aig_ObjCopy(pObjLi) );
    }
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    return pFrames;
}